

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::ModeState<unsigned_short,duckdb::ModeStandard<unsigned_short>>,double,duckdb::EntropyFunction<duckdb::ModeStandard<unsigned_short>>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  long in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  double *rdata_1;
  ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> **sdata_1;
  AggregateFinalizeData finalize_data;
  double *rdata;
  ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> **sdata;
  double *in_stack_ffffffffffffff78;
  ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *in_stack_ffffffffffffff80;
  ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *state;
  AggregateFinalizeData local_78;
  double *local_60;
  ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> **local_58;
  AggregateFinalizeData local_50;
  double *local_38;
  ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> **local_30;
  long local_28;
  ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *local_20;
  Vector *local_18;
  AggregateInputData *local_10;
  
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_30 = ConstantVector::
               GetData<duckdb::ModeState<unsigned_short,duckdb::ModeStandard<unsigned_short>>*>
                         ((Vector *)0xb35190);
    local_38 = ConstantVector::GetData<double>((Vector *)0xb3519f);
    AggregateFinalizeData::AggregateFinalizeData(&local_50,local_18,local_10);
    EntropyFunction<duckdb::ModeStandard<unsigned_short>>::
    Finalize<double,duckdb::ModeState<unsigned_short,duckdb::ModeStandard<unsigned_short>>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,(AggregateFinalizeData *)0xb351cf
              );
  }
  else {
    duckdb::Vector::SetVectorType((VectorType)local_18);
    local_58 = FlatVector::
               GetData<duckdb::ModeState<unsigned_short,duckdb::ModeStandard<unsigned_short>>*>
                         ((Vector *)0xb351ed);
    local_60 = FlatVector::GetData<double>((Vector *)0xb351fc);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,local_18,local_10);
    for (state = (ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *)0x0;
        state < local_20;
        state = (ModeState<unsigned_short,_duckdb::ModeStandard<unsigned_short>_> *)
                ((long)&(state->prevs).
                        super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                        super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>
                        ._M_impl.super__Vector_impl_data._M_start + 1)) {
      local_78.result_idx =
           (long)&(state->prevs).
                  super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                  super__Vector_base<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>.
                  _M_impl.super__Vector_impl_data._M_start + local_28;
      EntropyFunction<duckdb::ModeStandard<unsigned_short>>::
      Finalize<double,duckdb::ModeState<unsigned_short,duckdb::ModeStandard<unsigned_short>>>
                (state,in_stack_ffffffffffffff78,(AggregateFinalizeData *)0xb35262);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}